

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O2

size_t __thiscall io_buf::bin_write_fixed(io_buf *this,char *data,size_t len)

{
  char *in_RAX;
  uint64_t uVar1;
  char *p;
  char *local_28;
  
  if (len != 0) {
    local_28 = in_RAX;
    buf_write(this,&local_28,len);
    memcpy(local_28,data,len);
    if (this->_verify_hash == true) {
      uVar1 = uniform_hash(local_28,len,(ulong)this->_hash);
      this->_hash = (uint32_t)uVar1;
    }
  }
  return len;
}

Assistant:

size_t bin_write_fixed(const char* data, size_t len)
  {
    if (len > 0)
    {
      char* p;
      buf_write(p, len);

      memcpy(p, data, len);

      // compute hash for check-sum
      if (_verify_hash)
        _hash = (uint32_t)uniform_hash(p, len, _hash);
    }
    return len;
  }